

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O2

bool __thiscall ImGuiWS::setDrawData(ImGuiWS *this,ImDrawData *drawData)

{
  undefined1 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  unique_lock<std::shared_mutex> lock;
  unique_lock<std::shared_mutex> uStack_38;
  
  uVar1 = (**(code **)(*(long *)(((this->m_impl)._M_t.
                                  super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                  .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                compressorDrawData)._M_t + 0x10))();
  uVar2 = (**(code **)(*(long *)(((this->m_impl)._M_t.
                                  super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                  .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                compressorDrawData)._M_t + 0x18))();
  uVar3 = (**(code **)(*(long *)(((this->m_impl)._M_t.
                                  super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                  .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                compressorDrawData)._M_t + 0x20))();
  std::unique_lock<std::shared_mutex>::unique_lock
            (&uStack_38,
             &((this->m_impl)._M_t.
               super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
               super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
               super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->mutex);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::_M_move_assign((DrawLists *)
                   ((long)&((this->m_impl)._M_t.
                            super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                            .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->dataRead +
                   0x60),uVar2);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::_M_move_assign((DrawListsDiff *)
                   ((long)&((this->m_impl)._M_t.
                            super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                            .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->dataRead +
                   0x78),uVar3);
  std::unique_lock<std::shared_mutex>::~unique_lock(&uStack_38);
  return (bool)uVar1;
}

Assistant:

bool ImGuiWS::setDrawData(const ImDrawData * drawData) {
    bool result = true;

    result &= m_impl->compressorDrawData->setDrawData(drawData);

    auto & drawLists = m_impl->compressorDrawData->getDrawLists();
    auto & drawListsDiff = m_impl->compressorDrawData->getDrawListsDiff();

    // make the draw lists available to incppect clients
    {
        std::unique_lock lock(m_impl->mutex);

        m_impl->dataRead.drawLists = std::move(drawLists);
        m_impl->dataRead.drawListsDiff = std::move(drawListsDiff);
    }

    return result;
}